

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O1

int lib::io::Seek(State *state)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  UserData *pUVar3;
  String *this;
  long lVar4;
  int __whence;
  double dVar5;
  StackAPI api;
  string whence;
  StackAPI local_50;
  string local_40;
  
  luna::StackAPI::StackAPI(&local_50,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (&local_50,1,ValueT_UserData,ValueT_String,ValueT_Number);
  if (!bVar1) {
    return 0;
  }
  pUVar3 = luna::StackAPI::GetUserData(&local_50,0);
  __stream = (FILE *)pUVar3->user_data_;
  iVar2 = luna::StackAPI::GetStackSize(&local_50);
  if (iVar2 < 2) goto LAB_00120b39;
  this = luna::StackAPI::GetString(&local_50,1);
  luna::String::GetStdString_abi_cxx11_(&local_40,this);
  __whence = 0;
  if (iVar2 == 2) {
    lVar4 = 0;
  }
  else {
    dVar5 = luna::StackAPI::GetNumber(&local_50,2);
    lVar4 = (long)dVar5;
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
LAB_00120af5:
    iVar2 = fseek(__stream,lVar4,__whence);
    if (iVar2 != 0) {
      PushError(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return 2;
      }
      operator_delete(local_40._M_dataplus._M_p);
      return 2;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar2 == 0) {
      __whence = 1;
      goto LAB_00120af5;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar2 == 0) {
      __whence = 2;
      goto LAB_00120af5;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
LAB_00120b39:
  lVar4 = ftell(__stream);
  if (lVar4 < 0) {
    PushError(&local_50);
    return 2;
  }
  luna::StackAPI::PushNumber(&local_50,(double)lVar4);
  return 1;
}

Assistant:

int Seek(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_UserData,
                           luna::ValueT_String, luna::ValueT_Number))
            return 0;

        auto user_data = api.GetUserData(0);
        auto file = reinterpret_cast<std::FILE *>(user_data->GetData());

        auto params = api.GetStackSize();
        if (params > 1)
        {
            auto whence = api.GetString(1)->GetStdString();
            long offset = 0;
            if (params > 2)
                offset = static_cast<long>(api.GetNumber(2));

            int res = 0;
            if (whence == "set")
                res = std::fseek(file, offset, SEEK_SET);
            else if (whence == "cur")
                res = std::fseek(file, offset, SEEK_CUR);
            else if (whence == "end")
                res = std::fseek(file, offset, SEEK_END);

            if (res != 0)
                return PushError(api);
        }

        auto pos = std::ftell(file);
        if (pos < 0)
            return PushError(api);

        api.PushNumber(pos);
        return 1;
    }